

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

Bbl_Man_t * Bbl_ManReadBinaryBlif(char *pFileName)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Bbl_Man_t *__s;
  int *piVar7;
  Vec_Str_t *pVVar8;
  Vec_Str_t *pVVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  long lVar12;
  char *pStr_1;
  char *pStr_2;
  char *pStr;
  
  __s = (Bbl_Man_t *)malloc(0x4d0);
  memset(__s,0,0x4d0);
  iVar5 = Bbl_ManFileSize(pFileName);
  __s->nFileSize = iVar5;
  piVar7 = (int *)Bbl_ManFileRead(pFileName);
  __s->pFileData = (char *)piVar7;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 0;
  pVVar8->nSize = 0;
  pVVar8->pArray = (char *)0x0;
  lVar12 = (long)*piVar7;
  pVVar8->nSize = *piVar7;
  pVVar8->pArray = (char *)(piVar7 + 1);
  __s->pName = pVVar8;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 0;
  pVVar8->nSize = 0;
  pVVar8->pArray = (char *)0x0;
  iVar1 = *(int *)((long)piVar7 + lVar12 + 4);
  pVVar8->nSize = iVar1;
  pVVar8->pArray = (char *)((long)piVar7 + lVar12 + 8);
  __s->pObjs = pVVar8;
  pVVar9 = (Vec_Str_t *)malloc(0x10);
  pVVar9->nCap = 0;
  pVVar9->nSize = 0;
  pVVar9->pArray = (char *)0x0;
  lVar4 = (long)iVar1 + lVar12 + 4;
  iVar11 = *(int *)((long)piVar7 + lVar4 + 4);
  pVVar9->nSize = iVar11;
  pVVar9->pArray = (char *)((long)piVar7 + lVar4 + 8);
  __s->pFncs = pVVar9;
  if ((long)iVar11 + (long)iVar1 + lVar12 + 4 + 8 != (long)iVar5) {
    __assert_fail("pBuffer - p->pFileData == p->nFileSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                  ,0x2d7,"Bbl_Man_t *Bbl_ManReadBinaryBlif(char *)");
  }
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar10->pArray = piVar7;
  __s->vObj2Id = pVVar10;
  if (0 < pVVar8->nSize) {
    uVar6 = 0;
    do {
      pcVar3 = pVVar8->pArray;
      if (pcVar3 == (char *)0x0) {
        return __s;
      }
      iVar1 = *(int *)(pcVar3 + uVar6);
      uVar2 = pVVar10->nCap;
      if (pVVar10->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar10->pArray == (int *)0x0) {
            piVar7 = (int *)malloc(0x40);
          }
          else {
            piVar7 = (int *)realloc(pVVar10->pArray,0x40);
          }
          pVVar10->pArray = piVar7;
          iVar11 = 0x10;
        }
        else {
          iVar11 = uVar2 * 2;
          if (iVar11 <= (int)uVar2) goto LAB_004ac11a;
          if (pVVar10->pArray == (int *)0x0) {
            piVar7 = (int *)malloc((ulong)uVar2 << 3);
          }
          else {
            piVar7 = (int *)realloc(pVVar10->pArray,(ulong)uVar2 << 3);
          }
          pVVar10->pArray = piVar7;
        }
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                        ,0x155,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar10->nCap = iVar11;
      }
LAB_004ac11a:
      iVar11 = pVVar10->nSize;
      pVVar10->nSize = iVar11 + 1;
      pVVar10->pArray[iVar11] = iVar1;
      *(int *)(pcVar3 + uVar6) = pVVar10->nSize + -1;
      uVar6 = uVar6 + 0xc + (*(uint *)(pcVar3 + (ulong)uVar6 + 8) >> 4) * 4;
    } while ((int)uVar6 < pVVar8->nSize);
  }
  return __s;
}

Assistant:

Bbl_Man_t * Bbl_ManReadBinaryBlif( char * pFileName )
{
    Bbl_Man_t * p;
    Bbl_Obj_t * pObj;
    char * pBuffer;
    int h;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    p->nFileSize = Bbl_ManFileSize( pFileName );
    p->pFileData = Bbl_ManFileRead( pFileName );
    // extract three managers
    pBuffer = p->pFileData;
    p->pName = Vec_StrRead( &pBuffer );
    p->pObjs = Vec_StrRead( &pBuffer );
    p->pFncs = Vec_StrRead( &pBuffer );
    assert( pBuffer - p->pFileData == p->nFileSize );
    // remember original IDs in the objects
    p->vObj2Id = Vec_IntAlloc( 1000 );
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        Vec_IntPush( p->vObj2Id, pObj->Id );
        pObj->Id = Vec_IntSize(p->vObj2Id) - 1; 
    }
    return p;
}